

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O2

WFile * open_new_file(char *name,long perms)

{
  int iVar1;
  WFile *pWVar2;
  char *pcVar3;
  ulong uVar4;
  
  uVar4 = 0x1b6;
  if (perms != 0) {
    uVar4 = perms & 0xffffffff;
  }
  pWVar2 = (WFile *)0x0;
  iVar1 = open(name,0x241,uVar4);
  if (-1 < iVar1) {
    pWVar2 = (WFile *)safemalloc(1,0x10,0);
    pWVar2->fd = iVar1;
    pcVar3 = dupstr(name);
    pWVar2->name = pcVar3;
  }
  return pWVar2;
}

Assistant:

WFile *open_new_file(const char *name, long perms)
{
    int fd;
    WFile *ret;

    fd = open(name, O_CREAT | O_TRUNC | O_WRONLY,
              (mode_t)(perms ? perms : 0666));
    if (fd < 0)
        return NULL;

    ret = snew(WFile);
    ret->fd = fd;
    ret->name = dupstr(name);

    return ret;
}